

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t tree_enter_initial_dir(tree *t)

{
  long in_RDI;
  wchar_t r;
  wchar_t local_c;
  
  local_c = L'\0';
  if (((*(uint *)(in_RDI + 0x30) & 0x100) == 0) &&
     (local_c = fchdir(*(int *)(in_RDI + 0x74)), local_c == L'\0')) {
    *(uint *)(in_RDI + 0x30) = *(uint *)(in_RDI + 0x30) & 0xffffffbf;
    *(uint *)(in_RDI + 0x30) = *(uint *)(in_RDI + 0x30) | 0x100;
  }
  return local_c;
}

Assistant:

static int
tree_enter_initial_dir(struct tree *t)
{
	int r = 0;

	if ((t->flags & onInitialDir) == 0) {
		r = fchdir(t->initial_dir_fd);
		if (r == 0) {
			t->flags &= ~onWorkingDir;
			t->flags |= onInitialDir;
		}
	}
	return (r);
}